

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  ForNonContainerNonPointer<bool,_std::string> local_68;
  undefined1 local_48;
  char *local_40;
  size_type local_38;
  char local_30 [8];
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  bVar2 = **(bool **)this;
  local_48 = bVar2;
  to_string<bool>(&local_68,*(bool **)this);
  sVar3 = local_68._M_string_length;
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    uStack_28 = local_68.field_2._8_4_;
    uStack_24 = local_68.field_2._12_4_;
    local_68._M_dataplus._M_p = local_30;
  }
  local_38 = local_68._M_string_length;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity._0_4_ =
       local_68.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  __return_storage_ptr__->passed = bVar2;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  pcVar4 = local_68._M_dataplus._M_p + sVar3;
  local_40 = local_68._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_40,pcVar4);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }